

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

iter_result_opt * __thiscall
unodb::detail::
basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::next(iter_result_opt *__return_storage_ptr__,
      basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
      *this,uint8_t child_index)

{
  reference this_00;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  *this_01;
  iter_result<unodb::detail::olc_node_header> local_30;
  byte local_14;
  byte local_13;
  byte local_12;
  uint8_t local_11;
  byte key;
  uint8_t next_index;
  uchar nchildren;
  basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *pbStack_10;
  uint8_t child_index_local;
  basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_local;
  
  local_11 = child_index;
  pbStack_10 = this;
  local_12 = in_critical_section<unsigned_char>::load
                       (&(this->
                         super_basic_inode_16_parent<unodb::detail::basic_art_policy<std::span<const_std::byte>,_std::span<const_std::byte>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                         ).
                         super_basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                         .children_count);
  local_13 = local_11 + 1;
  if (local_13 < local_12) {
    this_00 = std::array<unodb::in_critical_section<std::byte>,_16UL>::operator[]
                        (&(this->keys).byte_array,(ulong)local_13);
    local_14 = in_critical_section<std::byte>::load(this_00);
    basic_node_ptr<unodb::detail::olc_node_header>::basic_node_ptr
              (&local_30.node,(header_type *)this,I16);
    local_30.key_byte = local_14;
    local_30.child_index = local_13;
    this_01 = basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
              ::get_key_prefix((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                *)this);
    local_30.prefix =
         key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
         ::get_snapshot((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                         *)&this_01->f);
    std::optional<unodb::detail::iter_result<unodb::detail::olc_node_header>_>::
    optional<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true>
              (__return_storage_ptr__,&local_30);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_payload._M_value.node.tagged_ptr = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
             )._M_payload.
             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
             ._M_payload + 8) = 0;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_payload._M_value.prefix = (key_prefix_snapshot)0;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_engaged = false;
    *(undefined7 *)
     &(__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      field_0x19 = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_16::iter_result_opt
  next(std::uint8_t child_index) noexcept {
    const auto nchildren{this->children_count.load()};
    const auto next_index{static_cast<std::uint8_t>(child_index + 1)};
    if (next_index >= nchildren) return parent_class::end_result;
    const auto key = keys.byte_array[next_index].load();
    return {{node_ptr{this, node_type::I16}, key, next_index,
             this->get_key_prefix().get_snapshot()}};
  }